

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::BasicTexSubImage3DCase::createTexture(BasicTexSubImage3DCase *this)

{
  deUint32 dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int width;
  int height;
  int depth;
  char *str;
  TransferFormat TVar5;
  void *pvVar6;
  PixelBufferAccess local_1a8;
  PixelBufferAccess local_180;
  int local_154;
  undefined1 local_150 [4];
  int cellSize;
  Vec4 colorB;
  Vec4 colorA;
  int z;
  int y;
  int x;
  int d;
  int h;
  int w;
  int levelD_1;
  int levelH_1;
  int levelW_1;
  int ndx_1;
  PixelBufferAccess local_e0;
  undefined1 local_b8 [8];
  Vec4 gMax;
  Vec4 gMin;
  int levelD;
  int levelH;
  int levelW;
  int ndx;
  deUint32 local_7c;
  deUint32 dStack_78;
  TransferFormat transferFmt;
  undefined1 local_68 [8];
  Random rnd;
  TextureLevel data;
  deUint32 tex;
  BasicTexSubImage3DCase *this_local;
  
  data.m_data.m_cap._4_4_ = 0;
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)&rnd.m_rnd.z,&(this->super_Texture3DSpecCase).m_texFormat);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar1 = deStringHash(str);
  de::Random::Random((Random *)local_68,dVar1);
  TVar5 = glu::getTransferFormat((this->super_Texture3DSpecCase).m_texFormat);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)((long)&data.m_data.m_cap + 4));
  sglr::ContextWrapper::glBindTexture
            (&(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper,0x806f,
             data.m_data.m_cap._4_4_);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,1);
  for (levelH = 0; local_7c = TVar5.format, dStack_78 = TVar5.dataType,
      levelH < (this->super_Texture3DSpecCase).m_numLevels; levelH = levelH + 1) {
    iVar2 = de::max<int>(1,(this->super_Texture3DSpecCase).m_width >> ((byte)levelH & 0x1f));
    iVar3 = de::max<int>(1,(this->super_Texture3DSpecCase).m_height >> ((byte)levelH & 0x1f));
    iVar4 = de::max<int>(1,(this->super_Texture3DSpecCase).m_depth >> ((byte)levelH & 0x1f));
    randomVector<4>((Functional *)(gMax.m_data + 2),(Random *)local_68,
                    &(this->super_Texture3DSpecCase).m_texFormatInfo.valueMin,
                    &(this->super_Texture3DSpecCase).m_texFormatInfo.valueMax);
    randomVector<4>((Functional *)local_b8,(Random *)local_68,
                    &(this->super_Texture3DSpecCase).m_texFormatInfo.valueMin,
                    &(this->super_Texture3DSpecCase).m_texFormatInfo.valueMax);
    tcu::TextureLevel::setSize((TextureLevel *)&rnd.m_rnd.z,iVar2,iVar3,iVar4);
    tcu::TextureLevel::getAccess(&local_e0,(TextureLevel *)&rnd.m_rnd.z);
    tcu::fillWithComponentGradients(&local_e0,(Vec4 *)(gMax.m_data + 2),(Vec4 *)local_b8);
    dVar1 = this->m_internalFormat;
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&levelW_1,(TextureLevel *)&rnd.m_rnd.z);
    pvVar6 = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)&levelW_1);
    sglr::ContextWrapper::glTexImage3D
              (&(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper,0x806f,
               levelH,dVar1,iVar2,iVar3,iVar4,0,local_7c,dStack_78,pvVar6);
  }
  for (levelH_1 = 0; levelH_1 < (this->super_Texture3DSpecCase).m_numLevels; levelH_1 = levelH_1 + 1
      ) {
    iVar2 = de::max<int>(1,(this->super_Texture3DSpecCase).m_width >> ((byte)levelH_1 & 0x1f));
    iVar3 = de::max<int>(1,(this->super_Texture3DSpecCase).m_height >> ((byte)levelH_1 & 0x1f));
    iVar4 = de::max<int>(1,(this->super_Texture3DSpecCase).m_depth >> ((byte)levelH_1 & 0x1f));
    width = de::Random::getInt((Random *)local_68,1,iVar2);
    height = de::Random::getInt((Random *)local_68,1,iVar3);
    depth = de::Random::getInt((Random *)local_68,1,iVar4);
    iVar2 = de::Random::getInt((Random *)local_68,0,iVar2 - width);
    iVar3 = de::Random::getInt((Random *)local_68,0,iVar3 - height);
    iVar4 = de::Random::getInt((Random *)local_68,0,iVar4 - depth);
    randomVector<4>((Functional *)(colorB.m_data + 2),(Random *)local_68,
                    &(this->super_Texture3DSpecCase).m_texFormatInfo.valueMin,
                    &(this->super_Texture3DSpecCase).m_texFormatInfo.valueMax);
    randomVector<4>((Functional *)local_150,(Random *)local_68,
                    &(this->super_Texture3DSpecCase).m_texFormatInfo.valueMin,
                    &(this->super_Texture3DSpecCase).m_texFormatInfo.valueMax);
    local_154 = de::Random::getInt((Random *)local_68,2,0x10);
    tcu::TextureLevel::setSize((TextureLevel *)&rnd.m_rnd.z,width,height,depth);
    tcu::TextureLevel::getAccess(&local_180,(TextureLevel *)&rnd.m_rnd.z);
    tcu::fillWithGrid(&local_180,local_154,(Vec4 *)(colorB.m_data + 2),(Vec4 *)local_150);
    tcu::TextureLevel::getAccess(&local_1a8,(TextureLevel *)&rnd.m_rnd.z);
    pvVar6 = tcu::PixelBufferAccess::getDataPtr(&local_1a8);
    sglr::ContextWrapper::glTexSubImage3D
              (&(this->super_Texture3DSpecCase).super_TextureSpecCase.super_ContextWrapper,0x806f,
               levelH_1,iVar2,iVar3,iVar4,width,height,depth,local_7c,dStack_78,pvVar6);
  }
  de::Random::~Random((Random *)local_68);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&rnd.m_rnd.z);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32				tex				= 0;
		tcu::TextureLevel		data			(m_texFormat);
		de::Random				rnd				(deStringHash(getName()));
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_3D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// First specify full texture.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			int		levelD		= de::max(1, m_depth >> ndx);
			Vec4	gMin		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			Vec4	gMax		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

			data.setSize(levelW, levelH, levelD);
			tcu::fillWithComponentGradients(data.getAccess(), gMin, gMax);

			glTexImage3D(GL_TEXTURE_3D, ndx, m_internalFormat, levelW, levelH, levelD, 0, transferFmt.format, transferFmt.dataType, data.getAccess().getDataPtr());
		}

		// Re-specify parts of each level.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			int		levelD		= de::max(1, m_depth >> ndx);

			int		w			= rnd.getInt(1, levelW);
			int		h			= rnd.getInt(1, levelH);
			int		d			= rnd.getInt(1, levelD);
			int		x			= rnd.getInt(0, levelW-w);
			int		y			= rnd.getInt(0, levelH-h);
			int		z			= rnd.getInt(0, levelD-d);

			Vec4	colorA		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			Vec4	colorB		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			int		cellSize	= rnd.getInt(2, 16);

			data.setSize(w, h, d);
			tcu::fillWithGrid(data.getAccess(), cellSize, colorA, colorB);

			glTexSubImage3D(GL_TEXTURE_3D, ndx, x, y, z, w, h, d, transferFmt.format, transferFmt.dataType, data.getAccess().getDataPtr());
		}
	}